

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O1

void __thiscall
FIX::ThreadedSocketInitiator::ThreadedSocketInitiator
          (ThreadedSocketInitiator *this,Application *application,MessageStoreFactory *factory,
          SessionSettings *settings,LogFactory *logFactory)

{
  _Rb_tree_header *p_Var1;
  
  Initiator::Initiator(&this->super_Initiator,application,factory,settings,logFactory);
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__ThreadedSocketInitiator_001ef818;
  p_Var1 = &(this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_settings).m_defaults._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001ed618;
  p_Var1 = &(this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header;
  (this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
       = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header + 0x18)
       = p_Var1;
  (this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_settings).m_defaults.m_name._M_dataplus._M_p =
       (pointer)&(this->m_settings).m_defaults.m_name.field_2;
  (this->m_settings).m_defaults.m_name._M_string_length = 0;
  (this->m_settings).m_defaults.m_name.field_2._M_local_buf[0] = '\0';
  (this->m_settings).m_resolveEnvVars = false;
  p_Var1 = &(this->m_sessionToHostNum)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sessionToHostNum)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sessionToHostNum)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_sessionToHostNum)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_sessionToHostNum)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_sessionToHostNum)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_lastConnect = 0;
  this->m_reconnectInterval = 0x1e;
  this->m_noDelay = false;
  this->m_sendBufSize = 0;
  this->m_rcvBufSize = 0;
  p_Var1 = &(this->m_threads)._M_t._M_impl.super__Rb_tree_header;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_mutex).m_count = 0;
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_init((pthread_mutex_t *)&this->m_mutex,(pthread_mutexattr_t *)0x0);
  socket_init();
  return;
}

Assistant:

ThreadedSocketInitiator::ThreadedSocketInitiator(
  Application& application,
  MessageStoreFactory& factory,
  const SessionSettings& settings,
  LogFactory& logFactory ) EXCEPT ( ConfigError )
: Initiator( application, factory, settings, logFactory ),
  m_lastConnect( 0 ), m_reconnectInterval( 30 ), m_noDelay( false ),
  m_sendBufSize( 0 ), m_rcvBufSize( 0 )
{
  socket_init();
}